

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_queue.cpp
# Opt level: O3

void mpmc_pointer_basics<int*,4ul>(void)

{
  code *pcVar1;
  double dVar2;
  char extraout_AL;
  bool bVar3;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  char extraout_AL_04;
  char extraout_AL_05;
  char extraout_AL_06;
  char extraout_AL_07;
  char extraout_AL_08;
  char extraout_AL_09;
  char extraout_AL_10;
  char extraout_AL_11;
  char extraout_AL_12;
  ulong *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Da_26;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  ResultBuilder DOCTEST_RB;
  size_t N;
  MPMC<int_*,_4UL> mpmc;
  Result local_3c8;
  ResultBuilder local_3a8;
  int *local_330 [2];
  Expression_lhs<const_unsigned_long> local_320;
  undefined8 *local_310;
  unsigned_long local_308;
  unsigned_long uStack_300;
  ulong local_2f8 [31];
  ulong local_200;
  ulong local_180;
  
  puVar4 = local_2f8;
  uVar5 = 0;
  do {
    *puVar4 = uVar5;
    uVar5 = uVar5 + 1;
    puVar4 = puVar4 + 2;
  } while (uVar5 != 0x10);
  local_200 = 0;
  local_180 = 0;
  local_308 = 0x10;
  local_310 = (undefined8 *)operator_new(0x44);
  *local_310 = 0;
  local_310[1] = 0;
  local_310[2] = 0;
  local_310[3] = 0;
  local_310[4] = 0;
  local_310[5] = 0;
  local_310[6] = 0;
  local_310[7] = 0;
  *(undefined4 *)(local_310 + 8) = 0;
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x253;
  local_3a8.super_AssertData.m_expr = "mpmc.capacity() == N";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  local_320.lhs = 0x10;
  local_320.m_at = DT_REQUIRE;
  doctest::detail::Expression_lhs<const_unsigned_long>::operator==<unsigned_long,_nullptr>
            (&local_3c8,&local_320,&local_308);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da;
  uVar11 = extraout_XMM0_Db;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_00;
    uVar11 = extraout_XMM0_Db_00;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x255;
  local_3a8.super_AssertData.m_expr = "mpmc.empty() == true";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  local_320.lhs = 0xc00000001 - (ulong)(local_180 < local_200);
  local_330[0] = (int *)CONCAT71(local_330[0]._1_7_,1);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c8,(Expression_lhs<bool_const> *)&local_320,(bool *)local_330);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_01;
  uVar11 = extraout_XMM0_Db_01;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_02;
    uVar11 = extraout_XMM0_Db_02;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_00 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_320.lhs = 0;
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x256;
  local_3a8.super_AssertData.m_expr = "mpmc.try_dequeue() == nullptr";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  uVar5 = local_180;
  do {
    while( true ) {
      uVar6 = uVar5;
      uVar8 = (ulong)(((uint)uVar6 & 0xf) << 4);
      uVar9 = *(ulong *)((long)local_2f8 + uVar8);
      uVar5 = local_180;
      if (uVar9 != uVar6 + 1) break;
      LOCK();
      bVar3 = uVar6 == local_180;
      if (bVar3) {
        local_180 = uVar9;
        uVar5 = uVar6;
      }
      UNLOCK();
      if (bVar3) {
        local_320.lhs = *(unsigned_long *)((long)&uStack_300 + uVar8);
        *(ulong *)((long)local_2f8 + uVar8) = uVar6 + 0x10;
        goto LAB_0014e7f7;
      }
    }
  } while (uVar6 + 1 <= uVar9);
LAB_0014e7f7:
  local_320.m_at = DT_REQUIRE;
  local_330[0] = (int *)0x0;
  doctest::detail::Expression_lhs<int*const>::operator==
            (&local_3c8,(Expression_lhs<int*const> *)&local_320,local_330);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_03;
  uVar11 = extraout_XMM0_Db_03;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_04;
    uVar11 = extraout_XMM0_Db_04;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_01 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_308 == 0) {
    uVar5 = 0;
  }
  else {
    uVar9 = 0;
    do {
      local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_3a8.super_AssertData.m_at = DT_REQUIRE;
      local_3a8.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_3a8.super_AssertData.m_line = 0x259;
      local_3a8.super_AssertData.m_expr = "mpmc.try_enqueue(&data[i]) == true";
      local_3a8.super_AssertData.m_failed = true;
      local_3a8.super_AssertData.m_threw = false;
      local_3a8.super_AssertData.m_threw_as = false;
      local_3a8.super_AssertData.m_exception_type = "";
      local_3a8.super_AssertData.m_exception_string = "";
      uVar5 = local_200;
      do {
        while( true ) {
          uVar8 = uVar5;
          uVar7 = (ulong)(((uint)uVar8 & 0xf) << 4);
          uVar6 = *(ulong *)((long)local_2f8 + uVar7);
          uVar5 = local_200;
          if (uVar6 != uVar8) break;
          LOCK();
          bVar3 = uVar8 == local_200;
          if (bVar3) {
            local_200 = uVar8 + 1;
            uVar5 = uVar8;
          }
          UNLOCK();
          if (bVar3) {
            *(ulong *)((long)&uStack_300 + uVar7) = (long)local_310 + uVar9 * 4;
            *(ulong *)((long)local_2f8 + uVar7) = uVar8 + 1;
            goto LAB_0014e9af;
          }
        }
      } while (uVar8 <= uVar6);
LAB_0014e9af:
      local_320.lhs = (ulong)(uVar6 == uVar8) | 0xc00000000;
      local_330[0] = (int *)CONCAT71(local_330[0]._1_7_,1);
      doctest::detail::Expression_lhs<bool_const>::operator==
                (&local_3c8,(Expression_lhs<bool_const> *)&local_320,(bool *)local_330);
      doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
      local_3a8.super_AssertData._40_2_ =
           CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
      uVar10 = extraout_XMM0_Da_05;
      uVar11 = extraout_XMM0_Db_05;
      if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
        uVar10 = extraout_XMM0_Da_06;
        uVar11 = extraout_XMM0_Db_06;
      }
      dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar11,uVar10));
      if (extraout_AL_02 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      if ((local_3a8.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                           local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                           local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                           local_3a8.super_AssertData.m_exception.field_0.buf[0]));
      }
      uVar9 = uVar9 + 1;
      uVar5 = local_308;
    } while (uVar9 < local_308);
  }
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x25c;
  local_3a8.super_AssertData.m_expr = "mpmc.try_enqueue(&data[N]) == false";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  uVar9 = local_200;
  do {
    while( true ) {
      uVar8 = uVar9;
      uVar7 = (ulong)(((uint)uVar8 & 0xf) << 4);
      uVar6 = *(ulong *)((long)local_2f8 + uVar7);
      uVar9 = local_200;
      if (uVar6 != uVar8) break;
      LOCK();
      bVar3 = uVar8 == local_200;
      if (bVar3) {
        local_200 = uVar8 + 1;
        uVar9 = uVar8;
      }
      UNLOCK();
      if (bVar3) {
        *(ulong *)((long)&uStack_300 + uVar7) = (long)local_310 + uVar5 * 4;
        *(ulong *)((long)local_2f8 + uVar7) = uVar8 + 1;
        goto LAB_0014eb90;
      }
    }
  } while (uVar8 <= uVar6);
LAB_0014eb90:
  local_320.lhs = (ulong)(uVar6 == uVar8) | 0xc00000000;
  local_330[0] = (int *)((ulong)local_330[0] & 0xffffffffffffff00);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c8,(Expression_lhs<bool_const> *)&local_320,(bool *)local_330);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_07;
  uVar11 = extraout_XMM0_Db_07;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_08;
    uVar11 = extraout_XMM0_Db_08;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_03 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x25d;
  local_3a8.super_AssertData.m_expr = "mpmc.empty() == false";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  local_320.lhs = (ulong)(local_200 <= local_180) | 0xc00000000;
  local_330[0] = (int *)((ulong)local_330[0] & 0xffffffffffffff00);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c8,(Expression_lhs<bool_const> *)&local_320,(bool *)local_330);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_09;
  uVar11 = extraout_XMM0_Db_09;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_10;
    uVar11 = extraout_XMM0_Db_10;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_04 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_308 != 0) {
    uVar5 = 0;
    do {
      local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_3a8.super_AssertData.m_at = DT_REQUIRE;
      local_3a8.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_3a8.super_AssertData.m_line = 0x260;
      local_3a8.super_AssertData.m_expr = "mpmc.try_dequeue() == &data[i]";
      local_3a8.super_AssertData.m_failed = true;
      local_3a8.super_AssertData.m_threw = false;
      local_3a8.super_AssertData.m_threw_as = false;
      local_3a8.super_AssertData.m_exception_type = "";
      local_3a8.super_AssertData.m_exception_string = "";
      uVar9 = local_180;
      do {
        while( true ) {
          uVar8 = uVar9;
          uVar7 = (ulong)(((uint)uVar8 & 0xf) << 4);
          uVar6 = *(ulong *)((long)local_2f8 + uVar7);
          uVar9 = local_180;
          if (uVar6 != uVar8 + 1) break;
          LOCK();
          bVar3 = uVar8 == local_180;
          if (bVar3) {
            local_180 = uVar6;
            uVar9 = uVar8;
          }
          UNLOCK();
          if (bVar3) {
            local_320.lhs = *(unsigned_long *)((long)&uStack_300 + uVar7);
            *(ulong *)((long)local_2f8 + uVar7) = uVar8 + 0x10;
            goto LAB_0014eea2;
          }
        }
      } while (uVar8 + 1 <= uVar6);
      local_320.lhs = 0;
LAB_0014eea2:
      local_320.m_at = DT_REQUIRE;
      local_330[0] = (int *)((long)local_310 + uVar5 * 4);
      doctest::detail::Expression_lhs<int*const>::operator==
                (&local_3c8,(Expression_lhs<int*const> *)&local_320,local_330);
      doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
      local_3a8.super_AssertData._40_2_ =
           CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
      uVar10 = extraout_XMM0_Da_11;
      uVar11 = extraout_XMM0_Db_11;
      if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
        uVar10 = extraout_XMM0_Da_12;
        uVar11 = extraout_XMM0_Db_12;
      }
      dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar11,uVar10));
      if (extraout_AL_05 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      if ((local_3a8.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                           local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                           local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                           local_3a8.super_AssertData.m_exception.field_0.buf[0]));
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_308);
  }
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x263;
  local_3a8.super_AssertData.m_expr = "mpmc.empty() == true";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  local_320.lhs = (ulong)(local_200 <= local_180) | 0xc00000000;
  local_330[0] = (int *)CONCAT71(local_330[0]._1_7_,1);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c8,(Expression_lhs<bool_const> *)&local_320,(bool *)local_330);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_13;
  uVar11 = extraout_XMM0_Db_13;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_14;
    uVar11 = extraout_XMM0_Db_14;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_06 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_320.lhs = 0;
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x264;
  local_3a8.super_AssertData.m_expr = "mpmc.try_dequeue() == nullptr";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  uVar5 = local_180;
  do {
    while( true ) {
      uVar6 = uVar5;
      uVar8 = (ulong)(((uint)uVar6 & 0xf) << 4);
      uVar9 = *(ulong *)((long)local_2f8 + uVar8);
      uVar5 = local_180;
      if (uVar9 != uVar6 + 1) break;
      LOCK();
      bVar3 = uVar6 == local_180;
      if (bVar3) {
        local_180 = uVar9;
        uVar5 = uVar6;
      }
      UNLOCK();
      if (bVar3) {
        local_320.lhs = *(unsigned_long *)((long)&uStack_300 + uVar8);
        *(ulong *)((long)local_2f8 + uVar8) = uVar6 + 0x10;
        goto LAB_0014f1cf;
      }
    }
  } while (uVar6 + 1 <= uVar9);
LAB_0014f1cf:
  local_320.m_at = DT_REQUIRE;
  local_330[0] = (int *)0x0;
  doctest::detail::Expression_lhs<int*const>::operator==
            (&local_3c8,(Expression_lhs<int*const> *)&local_320,local_330);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_15;
  uVar11 = extraout_XMM0_Db_15;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_16;
    uVar11 = extraout_XMM0_Db_16;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_07 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_308 == 0) {
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    uVar9 = local_200;
    do {
      do {
        do {
          uVar5 = uVar9;
          uVar8 = (ulong)(((uint)uVar5 & 0xf) << 4);
          uVar9 = local_200;
        } while (*(ulong *)((long)local_2f8 + uVar8) != uVar5);
        LOCK();
        bVar3 = uVar5 == local_200;
        if (bVar3) {
          local_200 = uVar5 + 1;
          uVar9 = uVar5;
        }
        UNLOCK();
      } while (!bVar3);
      *(ulong *)((long)&uStack_300 + uVar8) = (long)local_310 + uVar6 * 4;
      *(ulong *)((long)local_2f8 + uVar8) = uVar5 + 1;
      uVar6 = uVar6 + 1;
      uVar5 = local_308;
      uVar9 = local_200;
    } while (uVar6 < local_308);
  }
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x269;
  local_3a8.super_AssertData.m_expr = "mpmc.try_enqueue(&data[N]) == false";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  uVar9 = local_200;
  do {
    while( true ) {
      uVar8 = uVar9;
      uVar7 = (ulong)(((uint)uVar8 & 0xf) << 4);
      uVar6 = *(ulong *)((long)local_2f8 + uVar7);
      uVar9 = local_200;
      if (uVar6 != uVar8) break;
      LOCK();
      bVar3 = uVar8 == local_200;
      if (bVar3) {
        local_200 = uVar8 + 1;
        uVar9 = uVar8;
      }
      UNLOCK();
      if (bVar3) {
        *(ulong *)((long)&uStack_300 + uVar7) = (long)local_310 + uVar5 * 4;
        *(ulong *)((long)local_2f8 + uVar7) = uVar8 + 1;
        goto LAB_0014f3af;
      }
    }
  } while (uVar8 <= uVar6);
LAB_0014f3af:
  local_320.lhs = (ulong)(uVar6 == uVar8) | 0xc00000000;
  local_330[0] = (int *)((ulong)local_330[0] & 0xffffffffffffff00);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c8,(Expression_lhs<bool_const> *)&local_320,(bool *)local_330);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_17;
  uVar11 = extraout_XMM0_Db_17;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_18;
    uVar11 = extraout_XMM0_Db_18;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_08 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  if (local_308 != 0) {
    uVar5 = 0;
    do {
      local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_3a8.super_AssertData.m_at = DT_REQUIRE;
      local_3a8.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_3a8.super_AssertData.m_line = 0x26c;
      local_3a8.super_AssertData.m_expr = "mpmc.empty() == false";
      local_3a8.super_AssertData.m_failed = true;
      local_3a8.super_AssertData.m_threw = false;
      local_3a8.super_AssertData.m_threw_as = false;
      local_3a8.super_AssertData.m_exception_type = "";
      local_3a8.super_AssertData.m_exception_string = "";
      local_320.lhs = (ulong)(local_200 <= local_180) | 0xc00000000;
      local_330[0] = (int *)((ulong)local_330[0] & 0xffffffffffffff00);
      doctest::detail::Expression_lhs<bool_const>::operator==
                (&local_3c8,(Expression_lhs<bool_const> *)&local_320,(bool *)local_330);
      doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
      local_3a8.super_AssertData._40_2_ =
           CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
      uVar10 = extraout_XMM0_Da_19;
      uVar11 = extraout_XMM0_Db_19;
      if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
        uVar10 = extraout_XMM0_Da_20;
        uVar11 = extraout_XMM0_Db_20;
      }
      dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar11,uVar10));
      if (extraout_AL_09 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      if ((local_3a8.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                           local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                           local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                           local_3a8.super_AssertData.m_exception.field_0.buf[0]));
      }
      local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
      local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
      local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
      local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_3a8.super_AssertData.m_at = DT_REQUIRE;
      local_3a8.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
      ;
      local_3a8.super_AssertData.m_line = 0x26d;
      local_3a8.super_AssertData.m_expr = "mpmc.try_dequeue() == &data[i]";
      local_3a8.super_AssertData.m_failed = true;
      local_3a8.super_AssertData.m_threw = false;
      local_3a8.super_AssertData.m_threw_as = false;
      local_3a8.super_AssertData.m_exception_type = "";
      local_3a8.super_AssertData.m_exception_string = "";
      uVar9 = local_180;
      do {
        while( true ) {
          uVar8 = uVar9;
          uVar7 = (ulong)(((uint)uVar8 & 0xf) << 4);
          uVar6 = *(ulong *)((long)local_2f8 + uVar7);
          uVar9 = local_180;
          if (uVar6 != uVar8 + 1) break;
          LOCK();
          bVar3 = uVar8 == local_180;
          if (bVar3) {
            local_180 = uVar6;
            uVar9 = uVar8;
          }
          UNLOCK();
          if (bVar3) {
            local_320.lhs = *(unsigned_long *)((long)&uStack_300 + uVar7);
            *(ulong *)((long)local_2f8 + uVar7) = uVar8 + 0x10;
            goto LAB_0014f6ba;
          }
        }
      } while (uVar8 + 1 <= uVar6);
      local_320.lhs = 0;
LAB_0014f6ba:
      local_320.m_at = DT_REQUIRE;
      local_330[0] = (int *)((long)local_310 + uVar5 * 4);
      doctest::detail::Expression_lhs<int*const>::operator==
                (&local_3c8,(Expression_lhs<int*const> *)&local_320,local_330);
      doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
      local_3a8.super_AssertData._40_2_ =
           CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
      uVar10 = extraout_XMM0_Da_21;
      uVar11 = extraout_XMM0_Db_21;
      if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
         (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
        operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
        uVar10 = extraout_XMM0_Da_22;
        uVar11 = extraout_XMM0_Db_22;
      }
      dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar11,uVar10));
      if (extraout_AL_10 != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      if ((local_3a8.super_AssertData.m_failed == true) &&
         (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
        doctest::detail::throwException();
      }
      if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                           local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                           local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
      }
      if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
         ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                           local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
        operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                           local_3a8.super_AssertData.m_exception.field_0.buf[0]));
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_308);
  }
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x270;
  local_3a8.super_AssertData.m_expr = "mpmc.empty() == true";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  local_320.lhs = (ulong)(local_200 <= local_180) | 0xc00000000;
  local_330[0] = (int *)CONCAT71(local_330[0]._1_7_,1);
  doctest::detail::Expression_lhs<bool_const>::operator==
            (&local_3c8,(Expression_lhs<bool_const> *)&local_320,(bool *)local_330);
  doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
  local_3a8.super_AssertData._40_2_ =
       CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
  uVar10 = extraout_XMM0_Da_23;
  uVar11 = extraout_XMM0_Db_23;
  if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
     (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
    operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
    uVar10 = extraout_XMM0_Da_24;
    uVar11 = extraout_XMM0_Db_24;
  }
  dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar11,uVar10));
  if (extraout_AL_11 != '\0') {
    pcVar1 = (code *)swi(3);
    (*pcVar1)(SUB84(dVar2,0));
    return;
  }
  if ((local_3a8.super_AssertData.m_failed == true) &&
     (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3)) {
    doctest::detail::throwException();
  }
  if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                       local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                       local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                       local_3a8.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_320.lhs = 0;
  local_3a8.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_3a8.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_3a8.super_AssertData.m_at = DT_REQUIRE;
  local_3a8.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_queue.cpp"
  ;
  local_3a8.super_AssertData.m_line = 0x271;
  local_3a8.super_AssertData.m_expr = "mpmc.try_dequeue() == nullptr";
  local_3a8.super_AssertData.m_failed = true;
  local_3a8.super_AssertData.m_threw = false;
  local_3a8.super_AssertData.m_threw_as = false;
  local_3a8.super_AssertData.m_exception_type = "";
  local_3a8.super_AssertData.m_exception_string = "";
  uVar5 = local_180;
  do {
    while( true ) {
      uVar6 = uVar5;
      uVar8 = (ulong)(((uint)uVar6 & 0xf) << 4);
      uVar9 = *(ulong *)((long)local_2f8 + uVar8);
      uVar5 = local_180;
      if (uVar9 == uVar6 + 1) break;
      if (uVar9 < uVar6 + 1) {
LAB_0014fa31:
        local_320.m_at = DT_REQUIRE;
        local_330[0] = (int *)0x0;
        doctest::detail::Expression_lhs<int*const>::operator==
                  (&local_3c8,(Expression_lhs<int*const> *)&local_320,local_330);
        doctest::String::operator=(&local_3a8.super_AssertData.m_decomp,&local_3c8.m_decomp);
        local_3a8.super_AssertData._40_2_ =
             CONCAT11(local_3a8.super_AssertData.m_threw,local_3c8.m_passed) ^ 1;
        uVar10 = extraout_XMM0_Da_25;
        uVar11 = extraout_XMM0_Db_25;
        if ((local_3c8.m_decomp.field_0.buf[0x17] < '\0') &&
           (local_3c8.m_decomp.field_0.data.ptr != (char *)0x0)) {
          operator_delete__(local_3c8.m_decomp.field_0.data.ptr);
          uVar10 = extraout_XMM0_Da_26;
          uVar11 = extraout_XMM0_Db_26;
        }
        dVar2 = doctest::detail::ResultBuilder::log(&local_3a8,(double)CONCAT44(uVar11,uVar10));
        if (extraout_AL_12 == '\0') {
          if ((local_3a8.super_AssertData.m_failed == true) &&
             (bVar3 = doctest::detail::checkIfShouldThrow(local_3a8.super_AssertData.m_at), bVar3))
          {
            doctest::detail::throwException();
          }
          if ((local_3a8.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
             ((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                               local_3a8.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0))
          {
            operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_decomp.field_0._1_7_,
                                               local_3a8.super_AssertData.m_decomp.field_0.buf[0]));
          }
          if ((local_3a8.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
             ((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                               local_3a8.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0
             )) {
            operator_delete__((void *)CONCAT71(local_3a8.super_AssertData.m_exception.field_0._1_7_,
                                               local_3a8.super_AssertData.m_exception.field_0.buf[0]
                                              ));
          }
          operator_delete(local_310,0x44);
          return;
        }
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
    }
    LOCK();
    bVar3 = uVar6 == local_180;
    if (bVar3) {
      local_180 = uVar9;
      uVar5 = uVar6;
    }
    UNLOCK();
  } while (!bVar3);
  local_320.lhs = *(unsigned_long *)((long)&uStack_300 + uVar8);
  *(ulong *)((long)local_2f8 + uVar8) = uVar6 + 0x10;
  goto LAB_0014fa31;
}

Assistant:

void mpmc_pointer_basics() {

  tf::MPMC<T, LogSize> mpmc;
  size_t N = (1<<LogSize);
  std::vector<std::remove_pointer_t<T>> data(N+1);

  REQUIRE(mpmc.capacity() == N);

  REQUIRE(mpmc.empty() == true);
  REQUIRE(mpmc.try_dequeue() == nullptr);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_enqueue(&data[i]) == true);
  }

  REQUIRE(mpmc.try_enqueue(&data[N]) == false);
  REQUIRE(mpmc.empty() == false);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_dequeue() == &data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == nullptr);

  for(size_t i=0; i<N; i++) {
    mpmc.enqueue(&data[i]);
  }
  REQUIRE(mpmc.try_enqueue(&data[N]) == false);
  
  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.empty() == false);
    REQUIRE(mpmc.try_dequeue() == &data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == nullptr);
}